

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

bool __thiscall jrtplib::RTPUDPv4Transmitter::GetLocalIPList_Interfaces(RTPUDPv4Transmitter *this)

{
  size_t *psVar1;
  uint uVar2;
  short *psVar3;
  long *plVar4;
  long *in_RAX;
  _List_node_base *p_Var5;
  ifaddrs *addrs;
  long *local_28;
  
  local_28 = in_RAX;
  getifaddrs(&local_28);
  for (plVar4 = local_28; plVar4 != (long *)0x0; plVar4 = (long *)*plVar4) {
    psVar3 = (short *)plVar4[3];
    if ((psVar3 != (short *)0x0) && (*psVar3 == 2)) {
      uVar2 = *(uint *)(psVar3 + 2);
      p_Var5 = (_List_node_base *)operator_new(0x18);
      *(uint *)&p_Var5[1]._M_next =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
  }
  freeifaddrs(local_28);
  return (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&this->localIPs;
}

Assistant:

bool RTPUDPv4Transmitter::GetLocalIPList_Interfaces()
{
	struct ifaddrs *addrs,*tmp;
	
	getifaddrs(&addrs);
	tmp = addrs;
	
	while (tmp != 0)
	{
		if (tmp->ifa_addr != 0 && tmp->ifa_addr->sa_family == AF_INET)
		{
			struct sockaddr_in *inaddr = (struct sockaddr_in *)tmp->ifa_addr;
			localIPs.push_back(ntohl(inaddr->sin_addr.s_addr));
		}
		tmp = tmp->ifa_next;
	}
	
	freeifaddrs(addrs);
	
	if (localIPs.empty())
		return false;
	return true;
}